

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O2

bool libwebm::CopyAndEscapeStartCodes
               (uint8_t *raw_input,size_t raw_input_length,PacketDataBuffer *packet_buffer)

{
  bool bVar1;
  int iVar2;
  size_t i;
  size_t sVar3;
  uint8_t byte;
  uchar local_32;
  value_type_conflict local_31;
  
  if (packet_buffer != (PacketDataBuffer *)0x0 &&
      (raw_input_length != 0 && raw_input != (uint8_t *)0x0)) {
    iVar2 = 0;
    for (sVar3 = 0; raw_input_length != sVar3; sVar3 = sVar3 + 1) {
      if (raw_input[sVar3] == 0) {
        iVar2 = iVar2 + 1;
      }
      else {
        bVar1 = 1 < iVar2;
        iVar2 = 0;
        if ((bVar1) && (iVar2 = 0, (raw_input[sVar3] & 0xfd) == 1)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (packet_buffer,&local_32);
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(packet_buffer,&local_31)
      ;
    }
  }
  return packet_buffer != (PacketDataBuffer *)0x0 &&
         (raw_input_length != 0 && raw_input != (uint8_t *)0x0);
}

Assistant:

bool CopyAndEscapeStartCodes(const std::uint8_t* raw_input,
                             std::size_t raw_input_length,
                             PacketDataBuffer* packet_buffer) {
  if (raw_input == nullptr || raw_input_length < 1 || packet_buffer == nullptr)
    return false;

  int num_zeros = 0;
  for (std::size_t i = 0; i < raw_input_length; ++i) {
    const uint8_t byte = raw_input[i];

    if (byte == 0) {
      ++num_zeros;
    } else if (num_zeros >= 2 && (byte == 0x1 || byte == 0x3)) {
      packet_buffer->push_back(0x3);
      num_zeros = 0;
    } else {
      num_zeros = 0;
    }

    packet_buffer->push_back(byte);
  }

  return true;
}